

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  int *piVar15;
  double *pdVar16;
  uint uVar17;
  int *statesChild;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  double *pdVar21;
  ulong uVar22;
  long lVar23;
  double *pdVar24;
  double *pdVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  int i;
  long lVar29;
  long lVar30;
  int iVar31;
  double *pdVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int local_fc;
  
  for (uVar22 = 0; uVar22 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar22 = uVar22 + 1
      ) {
    local_fc = this->gPatternPartitionsStartPatterns[partitionIndices[uVar22]];
    iVar5 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar22] + 1];
    lVar18 = (long)iVar5;
    lVar29 = (long)local_fc;
    memset(this->integrationTmp + this->kStateCount * local_fc,0,
           (long)((iVar5 - local_fc) * this->kStateCount) << 3);
    iVar6 = cumulativeScaleIndices[uVar22];
    iVar7 = childBufferIndices[uVar22];
    pdVar11 = this->gTransitionMatrices[probabilityIndices[uVar22]];
    pdVar12 = this->gCategoryWeights[categoryWeightsIndices[uVar22]];
    pdVar13 = this->gStateFrequencies[stateFrequenciesIndices[uVar22]];
    pdVar14 = this->gPartials[parentBufferIndices[uVar22]];
    if ((iVar7 < this->kTipCount) && (piVar15 = this->gTipStates[iVar7], piVar15 != (int *)0x0)) {
      uVar17 = this->kStateCount;
      iVar7 = this->kPartialsPaddedStateCount;
      uVar8 = this->kCategoryCount;
      iVar26 = iVar7 * local_fc;
      iVar9 = this->kPatternCount;
      for (uVar20 = 0; uVar20 != (~((int)uVar8 >> 0x1f) & uVar8); uVar20 = uVar20 + 1) {
        iVar10 = this->kMatrixSize;
        lVar27 = (long)iVar26;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = pdVar12[uVar20];
        pdVar32 = pdVar14 + lVar27;
        iVar26 = uVar17 * local_fc;
        for (lVar30 = lVar29; lVar30 < lVar18; lVar30 = lVar30 + 1) {
          iVar31 = this->kTransPaddedStateCount;
          pdVar21 = this->integrationTmp;
          pdVar24 = pdVar11 + (long)(iVar10 * (int)uVar20) + (long)piVar15[lVar30];
          for (uVar28 = 0; (~((int)uVar17 >> 0x1f) & uVar17) != uVar28; uVar28 = uVar28 + 1) {
            dVar33 = *pdVar24;
            pdVar24 = pdVar24 + iVar31;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar21[(long)iVar26 + uVar28];
            auVar36._8_8_ = 0;
            auVar36._0_8_ = dVar33 * pdVar32[uVar28];
            auVar35 = vfmadd213sd_fma(auVar36,auVar34,auVar1);
            pdVar21[(long)iVar26 + uVar28] = auVar35._0_8_;
          }
          iVar26 = iVar26 + (int)uVar28;
          lVar27 = lVar27 + iVar7;
          pdVar32 = pdVar32 + iVar7;
        }
        iVar26 = (int)lVar27 + ((local_fc - iVar5) + iVar9) * iVar7;
      }
    }
    else {
      iVar9 = this->kPartialsPaddedStateCount;
      lVar30 = (long)iVar9;
      pdVar32 = this->gPartials[iVar7];
      uVar17 = this->kStateCount;
      iVar26 = iVar9 * local_fc;
      uVar8 = this->kCategoryCount;
      iVar7 = this->kPatternCount;
      for (uVar20 = 0; uVar20 != (~((int)uVar8 >> 0x1f) & uVar8); uVar20 = uVar20 + 1) {
        iVar10 = this->kMatrixSize;
        lVar27 = (long)iVar26;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = pdVar12[uVar20];
        pdVar24 = pdVar32 + lVar27 + 2;
        pdVar21 = pdVar32 + lVar27;
        uVar28 = (ulong)(uVar17 * local_fc);
        for (iVar26 = local_fc; iVar26 < iVar5; iVar26 = iVar26 + 1) {
          pdVar16 = this->integrationTmp;
          uVar28 = (ulong)(int)uVar28;
          uVar19 = 0;
          iVar31 = iVar10 * (int)uVar20;
          while (uVar19 != (~((int)uVar17 >> 0x1f) & uVar17)) {
            auVar37 = ZEXT816(0) << 0x40;
            pdVar25 = pdVar21;
            for (lVar23 = 0; auVar34 = auVar37, lVar23 < (int)uVar17 / 4 << 2; lVar23 = lVar23 + 4)
            {
              pdVar25 = pdVar25 + 4;
              auVar37 = vfmadd231pd_fma(auVar37,*(undefined1 (*) [16])(pdVar11 + iVar31 + lVar23),
                                        *(undefined1 (*) [16])(pdVar24 + lVar23 + -2));
              auVar37 = vfmadd231pd_fma(auVar37,*(undefined1 (*) [16])
                                                 (pdVar11 + (long)iVar31 + lVar23 + 2),
                                        *(undefined1 (*) [16])(pdVar24 + lVar23));
            }
            while (lVar23 < (int)uVar17) {
              auVar41._8_8_ = 0;
              auVar41._0_8_ = pdVar11[iVar31 + lVar23];
              lVar23 = lVar23 + 1;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *pdVar25;
              auVar34 = vfmadd231sd_fma(auVar34,auVar41,auVar2);
              pdVar25 = pdVar25 + 1;
            }
            auVar2 = vshufpd_avx(auVar37,auVar37,1);
            iVar31 = iVar31 + uVar17 + 1;
            lVar23 = lVar27 + uVar19;
            uVar19 = uVar19 + 1;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = pdVar16[uVar28];
            auVar38._8_8_ = 0;
            auVar38._0_8_ = (auVar2._0_8_ + auVar34._0_8_) * pdVar14[lVar23];
            auVar37 = vfmadd213sd_fma(auVar38,auVar35,auVar37);
            pdVar16[uVar28] = auVar37._0_8_;
            uVar28 = uVar28 + 1;
          }
          lVar27 = lVar27 + lVar30;
          pdVar24 = pdVar24 + lVar30;
          pdVar21 = pdVar21 + lVar30;
        }
        iVar26 = (int)lVar27 + ((local_fc - iVar5) + iVar7) * iVar9;
      }
    }
    local_fc = local_fc * this->kStateCount;
    for (lVar30 = lVar29; lVar30 < lVar18; lVar30 = lVar30 + 1) {
      auVar35 = ZEXT816(0) << 0x40;
      uVar17 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      for (uVar20 = 0; uVar17 != uVar20; uVar20 = uVar20 + 1) {
        auVar39._8_8_ = 0;
        auVar39._0_8_ = pdVar13[uVar20];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = this->integrationTmp[(long)local_fc + uVar20];
        auVar35 = vfmadd231sd_fma(auVar35,auVar39,auVar3);
      }
      local_fc = local_fc + uVar17;
      dVar33 = log(auVar35._0_8_);
      this->outLogLikelihoodsTmp[lVar30] = dVar33;
    }
    if (iVar6 != -1) {
      pdVar11 = this->outLogLikelihoodsTmp;
      pdVar12 = this->gScaleBuffers[iVar6];
      for (lVar30 = lVar29; lVar30 < lVar18; lVar30 = lVar30 + 1) {
        pdVar11[lVar30] = pdVar12[lVar30] + pdVar11[lVar30];
      }
    }
    auVar35 = ZEXT816(0) << 0x40;
    outSumLogLikelihoodByPartition[uVar22] = 0.0;
    pdVar11 = this->gPatternWeights;
    pdVar12 = this->outLogLikelihoodsTmp;
    for (; lVar29 < lVar18; lVar29 = lVar29 + 1) {
      auVar40._8_8_ = 0;
      auVar40._0_8_ = pdVar12[lVar29];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar11[lVar29];
      auVar35 = vfmadd231sd_fma(auVar35,auVar40,auVar4);
      outSumLogLikelihoodByPartition[uVar22] = auVar35._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child
            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
                        //                        for(int j = 0; j < kStateCount; j++) {
                        //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                        //                            w++;
                        //                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }
}